

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

void MapOptHandler_specialaction(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  int in_EAX;
  uint uVar2;
  int iVar3;
  long lVar4;
  FSpecialAction *pFVar5;
  int min_arg;
  int max_arg;
  int local_28;
  int local_24;
  
  local_28 = in_EAX;
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  uVar2 = TArray<FSpecialAction,_FSpecialAction>::Reserve(&info->specialactions,1);
  pFVar5 = (info->specialactions).Array + uVar2;
  if (parse->format_type == 1) {
    FScanner::SetCMode(&parse->sc,true);
  }
  FScanner::MustGetString(&parse->sc);
  iVar3 = FName::NameManager::FindName(&FName::NameData,(parse->sc).String,false);
  (pFVar5->Type).Index = iVar3;
  FScanner::CheckString(&parse->sc,",");
  FScanner::MustGetString(&parse->sc);
  iVar3 = P_FindLineSpecial((parse->sc).String,&local_28,&local_24);
  pFVar5->Action = (BYTE)iVar3;
  if (((BYTE)iVar3 == '\0') || (local_28 < 0)) {
    FScanner::ScriptError(&parse->sc,"Unknown specialaction \'%s\'",(parse->sc).String);
  }
  lVar4 = 2;
  do {
    bVar1 = FScanner::CheckString(&parse->sc,",");
    if (!bVar1) break;
    FScanner::MustGetNumber(&parse->sc);
    pFVar5->Args[lVar4 + -2] = (parse->sc).Number;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  if (parse->format_type == 1) {
    FScanner::SetCMode(&parse->sc,false);
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(specialaction, true)
{
	parse.ParseAssign();

	FSpecialAction *sa = &info->specialactions[info->specialactions.Reserve(1)];
	int min_arg, max_arg;
	if (parse.format_type == parse.FMT_Old) parse.sc.SetCMode(true);
	parse.sc.MustGetString();
	sa->Type = FName(parse.sc.String);
	parse.sc.CheckString(",");
	parse.sc.MustGetString();
	sa->Action = P_FindLineSpecial(parse.sc.String, &min_arg, &max_arg);
	if (sa->Action == 0 || min_arg < 0)
	{
		parse.sc.ScriptError("Unknown specialaction '%s'", parse.sc.String);
	}
	int j = 0;
	while (j < 5 && parse.sc.CheckString(","))
	{
		parse.sc.MustGetNumber();
		sa->Args[j++] = parse.sc.Number;
	}
	if (parse.format_type == parse.FMT_Old) parse.sc.SetCMode(false);
}